

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O0

void __thiscall OpenMD::ForceManager::longRangeInteractions(ForceManager *this)

{
  long *plVar1;
  int iVar2;
  undefined1 uVar3;
  byte bVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  SnapshotManager *this_00;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  reference piVar12;
  undefined8 *puVar13;
  long in_RDI;
  double dVar14;
  uint atom1_2;
  uint atom1_1;
  int m2;
  Mat3x3d bbox;
  bool update_nlist;
  int iLoop;
  int loopEnd;
  int loopStart;
  iterator jb;
  iterator ia;
  int gid2;
  int gid1;
  bool newAtom1;
  RealType mf;
  potVec selectionPotential;
  RealType surfacePotential;
  RealType reciprocalPotential;
  potVec selfPotential;
  potVec longRangePotential;
  vector<int,_std::allocator<int>_> atomListRow;
  vector<int,_std::allocator<int>_> atomListColumn;
  RealType swderiv;
  RealType dswdr;
  bool in_switching_region;
  Vector3d f1;
  Vector3d fg;
  Vector3d fij;
  RealType vij;
  RealType rgrp;
  RealType rgrpsq;
  Vector3d vel2;
  Vector3d gvel2;
  Vector3d dag;
  Vector3d d_grp;
  int atom2;
  int atom1;
  int cg2;
  int cg1;
  CutoffGroup *cg;
  CutoffGroupIterator ci;
  Molecule *mol;
  MoleculeIterator mi;
  DataStorage *cgConfig;
  DataStorage *config;
  Snapshot *curSnapshot;
  undefined4 in_stack_fffffffffffff558;
  int in_stack_fffffffffffff55c;
  Snapshot *in_stack_fffffffffffff560;
  Snapshot *this_01;
  InteractionData *in_stack_fffffffffffff568;
  Snapshot *v1;
  InteractionManager *in_stack_fffffffffffff570;
  Snapshot *this_02;
  iterator *in_stack_fffffffffffff578;
  undefined7 in_stack_fffffffffffff580;
  undefined1 in_stack_fffffffffffff587;
  uint in_stack_fffffffffffff5a0;
  undefined4 in_stack_fffffffffffff5a4;
  Vector3<double> *in_stack_fffffffffffff5a8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  *in_stack_fffffffffffff5b0;
  Vector3d *in_stack_fffffffffffff5d8;
  Snapshot *in_stack_fffffffffffff5e0;
  undefined4 in_stack_fffffffffffff5f8;
  int in_stack_fffffffffffff5fc;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
  *in_stack_fffffffffffff600;
  undefined4 in_stack_fffffffffffff630;
  value_type vVar15;
  undefined4 in_stack_fffffffffffff634;
  undefined6 in_stack_fffffffffffff6b8;
  undefined1 uVar16;
  undefined1 local_8f8 [56];
  undefined1 local_8c0 [112];
  undefined1 local_850 [56];
  undefined1 local_818 [168];
  undefined1 local_770 [112];
  undefined1 local_700 [56];
  uint local_6c8;
  uint local_6c4;
  undefined1 local_6a8 [96];
  undefined1 local_648 [24];
  undefined1 local_630 [72];
  int *local_5e8;
  int *local_5e0;
  undefined1 local_5c0 [96];
  undefined1 local_560 [24];
  undefined1 local_548 [72];
  int *local_500;
  int *local_4f8;
  undefined1 local_4d8 [144];
  undefined1 local_448 [96];
  undefined1 local_3e8 [24];
  double local_3d0;
  Vector<double,_7U> local_3c8;
  double local_390;
  Vector<double,_7U> local_388;
  double local_350;
  Vector<double,_7U> local_348;
  int *local_310;
  int *local_308;
  int *local_300;
  int *local_2f8;
  undefined1 local_2f0 [28];
  int local_2d4;
  undefined1 local_288 [27];
  byte local_26d;
  uint local_26c;
  int local_268;
  uint local_264;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_260;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_258;
  undefined4 local_24c;
  undefined4 local_248;
  byte local_241;
  pointer local_240;
  double local_238;
  Vector<double,_7U> local_230;
  RealType local_1f8;
  RealType local_1f0;
  double local_1e8;
  Vector<double,_7U> local_1e0;
  double local_198;
  Vector<double,_7U> local_190;
  vector<int,_std::allocator<int>_> local_158;
  vector<int,_std::allocator<int>_> local_140;
  double local_128;
  double local_120;
  byte local_111;
  Vector<double,_3U> local_e0;
  double local_c8;
  double local_c0;
  double local_b8;
  int local_50;
  int local_4c;
  value_type local_48;
  int local_44;
  CutoffGroup *local_40;
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  local_38;
  Molecule *local_30;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_28;
  DataStorage *local_20;
  Snapshot *local_18;
  Snapshot *local_10;
  
  this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 0x18));
  local_10 = SnapshotManager::getCurrentSnapshot(this_00);
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x10))(*(long **)(in_RDI + 0x30),local_10);
  local_18 = local_10;
  local_20 = &local_10->cgData;
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_28);
  __gnu_cxx::
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  ::__normal_iterator(&local_38);
  uVar6 = SimInfo::getNCutoffGroups(*(SimInfo **)(in_RDI + 0x18));
  uVar7 = SimInfo::getNAtoms(*(SimInfo **)(in_RDI + 0x18));
  if (uVar6 == uVar7) {
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
              (in_stack_fffffffffffff600,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator=
              (in_stack_fffffffffffff600,
               (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
               CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
  }
  else {
    local_30 = SimInfo::beginMolecule
                         ((SimInfo *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
                          (MoleculeIterator *)in_stack_fffffffffffff578);
    while (local_30 != (Molecule *)0x0) {
      local_40 = Molecule::beginCutoffGroup
                           ((Molecule *)
                            CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
                            in_stack_fffffffffffff578);
      while (local_40 != (CutoffGroup *)0x0) {
        CutoffGroup::updateCOM
                  ((CutoffGroup *)CONCAT44(in_stack_fffffffffffff634,in_stack_fffffffffffff630));
        local_40 = Molecule::nextCutoffGroup
                             ((Molecule *)
                              CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
                              in_stack_fffffffffffff578);
      }
      local_30 = SimInfo::nextMolecule
                           ((SimInfo *)CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580)
                            ,(MoleculeIterator *)in_stack_fffffffffffff578);
    }
  }
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x28))();
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x20))();
  Vector3<double>::Vector3((Vector3<double> *)0x14a5c4);
  Vector3<double>::Vector3((Vector3<double> *)0x14a5d1);
  Vector3<double>::Vector3((Vector3<double> *)0x14a5de);
  Vector3<double>::Vector3((Vector3<double> *)0x14a5eb);
  local_c8 = 0.0;
  Vector3<double>::Vector3((Vector3<double> *)0x14a604);
  Vector3<double>::Vector3((Vector3<double> *)0x14a611);
  Vector3<double>::Vector3((Vector3<double> *)0x14a61e);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x14a62b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x14a638);
  local_198 = 0.0;
  Vector<double,_7U>::Vector(&local_190,&local_198);
  local_1e8 = 0.0;
  Vector<double,_7U>::Vector(&local_1e0,&local_1e8);
  local_1f0 = 0.0;
  local_1f8 = 0.0;
  local_238 = 0.0;
  Vector<double,_7U>::Vector(&local_230,&local_238);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            (&local_258);
  __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::__normal_iterator
            (&local_260);
  *(undefined8 *)(in_RDI + 0x890) = *(undefined8 *)(in_RDI + 0x50);
  *(byte *)(in_RDI + 0x898) = -(*(int *)(in_RDI + 0x68) == 2) & 1;
  uVar16 = true;
  if (*(int *)(in_RDI + 0x68) != 3) {
    uVar16 = *(int *)(in_RDI + 0x68) == 4;
  }
  *(undefined1 *)(in_RDI + 0x899) = uVar16;
  *(byte *)(in_RDI + 0x938) = *(byte *)(in_RDI + 9) & 1;
  *(byte *)(in_RDI + 0x939) = *(byte *)(in_RDI + 10) & 1;
  *(byte *)(in_RDI + 0x93a) = *(byte *)(in_RDI + 0xb) & 1;
  *(byte *)(in_RDI + 0xc08) = *(byte *)(in_RDI + 9) & 1;
  local_268 = 1;
  uVar3 = SimInfo::requiresPrepair(*(SimInfo **)(in_RDI + 0x18));
  local_264 = (uint)!(bool)uVar3;
  for (local_26c = local_264; (int)local_26c <= local_268; local_26c = local_26c + 1) {
    if (local_26c == local_264) {
      plVar1 = *(long **)(in_RDI + 0x30);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
                (in_stack_fffffffffffff5b0,
                 (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 in_stack_fffffffffffff5a8);
      bVar4 = (**(code **)(*plVar1 + 0x80))(plVar1,local_288);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 in_stack_fffffffffffff570);
      local_26d = bVar4 & 1;
      if (local_26d != 0) {
        if ((*(byte *)(in_RDI + 0xe) & 1) == 0) {
          Thermo::getBoundingBox
                    ((Thermo *)CONCAT17(uVar16,CONCAT16(uVar3,in_stack_fffffffffffff6b8)));
          SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x14a8a9);
        }
        (**(code **)(**(long **)(in_RDI + 0x30) + 0x88))
                  (*(long **)(in_RDI + 0x30),in_RDI + 0x148,in_RDI + 0x160,in_RDI + 0x178);
      }
    }
    for (local_44 = 0; iVar2 = local_44,
        sVar9 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x160)),
        iVar2 < (int)sVar9 + -1; local_44 = local_44 + 1) {
      (**(code **)(**(long **)(in_RDI + 0x30) + 0x98))(*(long **)(in_RDI + 0x30),local_44);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff600,
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
      local_241 = 1;
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x160),(long)local_44);
      for (local_2d4 = *pvVar10; iVar2 = local_2d4,
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x160),
                               (long)(local_44 + 1)), iVar2 < *pvVar10; local_2d4 = local_2d4 + 1) {
        pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                            ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x148),(long)local_2d4);
        local_48 = *pvVar10;
        (**(code **)(**(long **)(in_RDI + 0x30) + 200))
                  (local_2f0,*(long **)(in_RDI + 0x30),local_44,local_48);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffff560,
                   (Vector3<double> *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558))
        ;
        local_b8 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x14aa76);
        if (local_b8 < *(double *)(in_RDI + 0x58)) {
          if (local_26c == 1) {
            local_c8 = 0.0;
            Vector<double,_3U>::zero(&local_e0);
            Vector<double,_3U>::zero((Vector<double,_3U> *)(in_RDI + 0xb70));
            Vector<double,_3U>::zero((Vector<double,_3U> *)(in_RDI + 0xb88));
            *(undefined8 *)(in_RDI + 0xbb0) = 0;
            *(undefined8 *)(in_RDI + 3000) = 0;
          }
          local_111 = SwitchingFunction::getSwitch
                                ((SwitchingFunction *)
                                 CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
                                 (RealType *)in_stack_fffffffffffff578,
                                 (RealType *)in_stack_fffffffffffff570,
                                 (RealType *)in_stack_fffffffffffff568,
                                 (RealType *)in_stack_fffffffffffff560);
          (**(code **)(**(long **)(in_RDI + 0x30) + 0xa0))(*(long **)(in_RDI + 0x30),local_48);
          std::vector<int,_std::allocator<int>_>::operator=
                    ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff600,
                     (vector<int,_std::allocator<int>_> *)
                     CONCAT44(in_stack_fffffffffffff5fc,in_stack_fffffffffffff5f8));
          if ((*(byte *)(in_RDI + 0xc) & 1) != 0) {
            (**(code **)(**(long **)(in_RDI + 0x30) + 0x90))(*(long **)(in_RDI + 0x30),local_48);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff560,
                       (Vector3<double> *)
                       CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
          }
          local_2f8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                       ((vector<int,_std::allocator<int>_> *)
                                        CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558
                                                ));
          local_258._M_current = local_2f8;
          while( true ) {
            local_300 = (int *)std::vector<int,_std::allocator<int>_>::end
                                         ((vector<int,_std::allocator<int>_> *)
                                          CONCAT44(in_stack_fffffffffffff55c,
                                                   in_stack_fffffffffffff558));
            bVar5 = __gnu_cxx::operator!=
                              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               in_stack_fffffffffffff560,
                               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                               CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
            if (!bVar5) break;
            piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*(&local_258);
            local_4c = *piVar12;
            sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_158);
            if (1 < sVar9) {
              local_241 = 1;
            }
            if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
              local_248 = (**(code **)(**(long **)(in_RDI + 0x30) + 0xf8))
                                    (*(long **)(in_RDI + 0x30),local_4c);
              bVar5 = SelectionManager::isGlobalIDSelected
                                ((SelectionManager *)in_stack_fffffffffffff560,
                                 in_stack_fffffffffffff55c);
              *(bool *)(in_RDI + 0x93b) = bVar5;
            }
            local_308 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                         ((vector<int,_std::allocator<int>_> *)
                                          CONCAT44(in_stack_fffffffffffff55c,
                                                   in_stack_fffffffffffff558));
            local_260._M_current = local_308;
            while( true ) {
              local_310 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            CONCAT44(in_stack_fffffffffffff55c,
                                                     in_stack_fffffffffffff558));
              bVar5 = __gnu_cxx::operator!=
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffff560,
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
              if (!bVar5) break;
              piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&local_260);
              local_50 = *piVar12;
              if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
                local_24c = (**(code **)(**(long **)(in_RDI + 0x30) + 0x100))
                                      (*(long **)(in_RDI + 0x30),local_50);
                bVar5 = SelectionManager::isGlobalIDSelected
                                  ((SelectionManager *)in_stack_fffffffffffff560,
                                   in_stack_fffffffffffff55c);
                *(bool *)(in_RDI + 0x93b) = (*(byte *)(in_RDI + 0x93b) & 1) != 0 || bVar5;
              }
              bVar4 = (**(code **)(**(long **)(in_RDI + 0x30) + 0xe8))
                                (*(long **)(in_RDI + 0x30),local_4c,local_50,local_44,local_48);
              if ((bVar4 & 1) == 0) {
                *(undefined8 *)(in_RDI + 0x930) = 0;
                local_350 = 0.0;
                Vector<double,_7U>::Vector(&local_348,&local_350);
                Vector<double,_7U>::operator=
                          ((Vector<double,_7U> *)in_stack_fffffffffffff568,
                           (Vector<double,_7U> *)in_stack_fffffffffffff560);
                local_390 = 0.0;
                Vector<double,_7U>::Vector(&local_388,&local_390);
                Vector<double,_7U>::operator=
                          ((Vector<double,_7U> *)in_stack_fffffffffffff568,
                           (Vector<double,_7U> *)in_stack_fffffffffffff560);
                local_3d0 = 0.0;
                Vector<double,_7U>::Vector(&local_3c8,&local_3d0);
                Vector<double,_7U>::operator=
                          ((Vector<double,_7U> *)in_stack_fffffffffffff568,
                           (Vector<double,_7U> *)in_stack_fffffffffffff560);
                Vector<double,_3U>::zero((Vector<double,_3U> *)(in_RDI + 0x988));
                *(undefined8 *)(in_RDI + 0xb60) = 0;
                *(undefined8 *)(in_RDI + 0xb68) = 0;
                (**(code **)(**(long **)(in_RDI + 0x30) + 0x130))
                          (*(long **)(in_RDI + 0x30),in_RDI + 0x860,local_4c,local_50,local_241 & 1)
                ;
                local_241 = 0;
                uVar8 = (**(code **)(**(long **)(in_RDI + 0x30) + 0x110))
                                  (*(long **)(in_RDI + 0x30),local_4c,local_50);
                *(undefined4 *)(in_RDI + 0x8a8) = uVar8;
                pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 400),
                                     (long)*(int *)(in_RDI + 0x8a8));
                *(value_type *)(in_RDI + 0x8b0) = *pvVar11;
                pvVar11 = std::vector<double,_std::allocator<double>_>::operator[]
                                    ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1a8),
                                     (long)*(int *)(in_RDI + 0x8a8));
                *(value_type *)(in_RDI + 0x8b8) = *pvVar11;
                sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_158);
                if ((sVar9 == 1) &&
                   (sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_140), sVar9 == 1)) {
                  Vector3<double>::operator=
                            ((Vector3<double> *)in_stack_fffffffffffff560,
                             (Vector3<double> *)
                             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
                  *(double *)(in_RDI + 0x888) = local_b8;
                  if ((*(byte *)(in_RDI + 0xc) & 1) != 0) {
                    Vector3<double>::operator=
                              ((Vector3<double> *)in_stack_fffffffffffff560,
                               (Vector3<double> *)
                               CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
                  }
                }
                else {
                  (**(code **)(**(long **)(in_RDI + 0x30) + 0xd0))
                            (local_3e8,*(long **)(in_RDI + 0x30),local_4c,local_50);
                  Vector3<double>::operator=
                            ((Vector3<double> *)in_stack_fffffffffffff560,
                             (Vector3<double> *)
                             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
                  Snapshot::wrapVector(in_stack_fffffffffffff5e0,in_stack_fffffffffffff5d8);
                  dVar14 = Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x14b151);
                  *(double *)(in_RDI + 0x888) = dVar14;
                  if ((*(byte *)(in_RDI + 0xc) & 1) != 0) {
                    (**(code **)(**(long **)(in_RDI + 0x30) + 0x128))
                              (*(long **)(in_RDI + 0x30),local_50);
                    Vector3<double>::operator=
                              ((Vector3<double> *)in_stack_fffffffffffff560,
                               (Vector3<double> *)
                               CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
                  }
                }
                dVar14 = sqrt(*(double *)(in_RDI + 0x888));
                *(double *)(in_RDI + 0x880) = dVar14;
                if (local_26c == 0) {
                  InteractionManager::doPrePair(in_stack_fffffffffffff570,in_stack_fffffffffffff568)
                  ;
                  (**(code **)(**(long **)(in_RDI + 0x30) + 0x138))
                            (*(long **)(in_RDI + 0x30),in_RDI + 0x860,local_4c,local_50);
                }
                else {
                  InteractionManager::doPair(in_stack_fffffffffffff570,in_stack_fffffffffffff568);
                  (**(code **)(**(long **)(in_RDI + 0x30) + 0x140))
                            (*(long **)(in_RDI + 0x30),in_RDI + 0x860,local_4c,local_50);
                  local_c8 = local_c8 + *(double *)(in_RDI + 0x930);
                  Vector<double,_3U>::operator+=
                            ((Vector<double,_3U> *)in_stack_fffffffffffff560,
                             (Vector<double,_3U> *)
                             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
                  outProduct<double>(in_stack_fffffffffffff5a8,
                                     (Vector3<double> *)
                                     CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0));
                  RectMatrix<double,_3U,_3U>::operator-=
                            ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff560,
                             (RectMatrix<double,_3U,_3U> *)
                             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
                  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x14b314);
                  if ((*(byte *)(in_RDI + 0xc) & 1) != 0) {
                    plVar1 = *(long **)(in_RDI + 0x30);
                    dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffff570,
                                   (Vector<double,_3U> *)in_stack_fffffffffffff568);
                    OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff568,
                                      (double)in_stack_fffffffffffff560);
                    Vector3<double>::Vector3
                              ((Vector3<double> *)in_stack_fffffffffffff560,
                               (Vector<double,_3U> *)
                               CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
                    (**(code **)(*plVar1 + 0x168))(plVar1,local_448);
                  }
                }
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&local_260);
            }
            __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                      (&local_258);
          }
          if ((local_26c == 1) && ((local_111 & 1) != 0)) {
            local_128 = (local_c8 * local_120) / local_c0;
            OpenMD::operator*((double)in_stack_fffffffffffff568,
                              (Vector<double,_3U> *)in_stack_fffffffffffff560);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_fffffffffffff568,
                       (Vector<double,_3U> *)in_stack_fffffffffffff560);
            Vector<double,_3U>::operator+=
                      ((Vector<double,_3U> *)in_stack_fffffffffffff560,
                       (Vector<double,_3U> *)
                       CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
            sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_158);
            if ((sVar9 == 1) &&
               (sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_140), sVar9 == 1)) {
              plVar1 = *(long **)(in_RDI + 0x30);
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_158,0);
              vVar15 = *pvVar10;
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&local_140,0);
              bVar4 = (**(code **)(*plVar1 + 0xe8))(plVar1,vVar15,*pvVar10,local_44,local_48);
              if ((bVar4 & 1) == 0) {
                outProduct<double>(in_stack_fffffffffffff5a8,
                                   (Vector3<double> *)
                                   CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0));
                RectMatrix<double,_3U,_3U>::operator-=
                          ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff560,
                           (RectMatrix<double,_3U,_3U> *)
                           CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
                SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x14b5b9);
                if ((*(byte *)(in_RDI + 0xc) & 1) != 0) {
                  plVar1 = *(long **)(in_RDI + 0x30);
                  dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffff570,
                                 (Vector<double,_3U> *)in_stack_fffffffffffff568);
                  OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff568,
                                    (double)in_stack_fffffffffffff560);
                  Vector3<double>::Vector3
                            ((Vector3<double> *)in_stack_fffffffffffff560,
                             (Vector<double,_3U> *)
                             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
                  (**(code **)(*plVar1 + 0x168))(plVar1,local_4d8);
                }
              }
            }
            local_4f8 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                         ((vector<int,_std::allocator<int>_> *)
                                          CONCAT44(in_stack_fffffffffffff55c,
                                                   in_stack_fffffffffffff558));
            local_258._M_current = local_4f8;
            while( true ) {
              local_500 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            CONCAT44(in_stack_fffffffffffff55c,
                                                     in_stack_fffffffffffff558));
              bVar5 = __gnu_cxx::operator!=
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffff560,
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
              if (!bVar5) break;
              piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&local_258);
              local_4c = *piVar12;
              in_stack_fffffffffffff600 =
                   (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   (**(code **)(**(long **)(in_RDI + 0x30) + 0xb8))
                             (*(long **)(in_RDI + 0x30),local_4c);
              local_240 = (in_stack_fffffffffffff600->
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          )._M_impl.super__Vector_impl_data._M_start;
              OpenMD::operator*((double)in_stack_fffffffffffff568,
                                (Vector<double,_3U> *)in_stack_fffffffffffff560);
              OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff568,
                                (double)in_stack_fffffffffffff560);
              Vector3<double>::operator=
                        ((Vector3<double> *)in_stack_fffffffffffff568,
                         (Vector<double,_3U> *)in_stack_fffffffffffff560);
              plVar1 = *(long **)(in_RDI + 0x30);
              in_stack_fffffffffffff5fc = local_4c;
              Vector3<double>::Vector3
                        ((Vector3<double> *)in_stack_fffffffffffff560,
                         (Vector3<double> *)
                         CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
              (**(code **)(*plVar1 + 0x118))(plVar1,in_stack_fffffffffffff5fc,local_548);
              sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_158);
              if ((1 < sVar9) &&
                 (bVar5 = SimInfo::usesAtomicVirial(*(SimInfo **)(in_RDI + 0x18)), bVar5)) {
                (**(code **)(**(long **)(in_RDI + 0x30) + 0xa8))
                          (local_560,*(long **)(in_RDI + 0x30),local_4c,local_44);
                Vector3<double>::operator=
                          ((Vector3<double> *)in_stack_fffffffffffff560,
                           (Vector3<double> *)
                           CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
                outProduct<double>(in_stack_fffffffffffff5a8,
                                   (Vector3<double> *)
                                   CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0));
                RectMatrix<double,_3U,_3U>::operator-=
                          ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff560,
                           (RectMatrix<double,_3U,_3U> *)
                           CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
                SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x14b8c4);
                if ((*(byte *)(in_RDI + 0xc) & 1) != 0) {
                  in_stack_fffffffffffff5d8 = *(Vector3d **)(in_RDI + 0x30);
                  in_stack_fffffffffffff5e0 =
                       (Snapshot *)
                       dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffff570,
                                      (Vector<double,_3U> *)in_stack_fffffffffffff568);
                  OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff568,
                                    (double)in_stack_fffffffffffff560);
                  Vector3<double>::Vector3
                            ((Vector3<double> *)in_stack_fffffffffffff560,
                             (Vector<double,_3U> *)
                             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
                  (**(code **)((long)(in_stack_fffffffffffff5d8->super_Vector<double,_3U>).data_[0]
                              + 0x168))(in_stack_fffffffffffff5d8,local_5c0);
                }
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&local_258);
            }
            local_5e0 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                         ((vector<int,_std::allocator<int>_> *)
                                          CONCAT44(in_stack_fffffffffffff55c,
                                                   in_stack_fffffffffffff558));
            local_260._M_current = local_5e0;
            while( true ) {
              local_5e8 = (int *)std::vector<int,_std::allocator<int>_>::end
                                           ((vector<int,_std::allocator<int>_> *)
                                            CONCAT44(in_stack_fffffffffffff55c,
                                                     in_stack_fffffffffffff558));
              bVar5 = __gnu_cxx::operator!=
                                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)in_stack_fffffffffffff560,
                                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                  *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
              if (!bVar5) break;
              piVar12 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ::operator*(&local_260);
              local_50 = *piVar12;
              puVar13 = (undefined8 *)
                        (**(code **)(**(long **)(in_RDI + 0x30) + 0xc0))
                                  (*(long **)(in_RDI + 0x30),local_50);
              local_240 = (pointer)*puVar13;
              OpenMD::operator*((double)in_stack_fffffffffffff568,
                                (Vector<double,_3U> *)in_stack_fffffffffffff560);
              OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff568,
                                (double)in_stack_fffffffffffff560);
              Vector3<double>::operator=
                        ((Vector3<double> *)in_stack_fffffffffffff568,
                         (Vector<double,_3U> *)in_stack_fffffffffffff560);
              iVar2 = local_50;
              plVar1 = *(long **)(in_RDI + 0x30);
              Vector3<double>::Vector3
                        ((Vector3<double> *)in_stack_fffffffffffff560,
                         (Vector3<double> *)
                         CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
              (**(code **)(*plVar1 + 0x120))(plVar1,iVar2,local_630);
              sVar9 = std::vector<int,_std::allocator<int>_>::size(&local_140);
              if ((1 < sVar9) &&
                 (bVar5 = SimInfo::usesAtomicVirial(*(SimInfo **)(in_RDI + 0x18)), bVar5)) {
                (**(code **)(**(long **)(in_RDI + 0x30) + 0xb0))
                          (local_648,*(long **)(in_RDI + 0x30),local_50,local_48);
                Vector3<double>::operator=
                          ((Vector3<double> *)in_stack_fffffffffffff560,
                           (Vector3<double> *)
                           CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
                outProduct<double>(in_stack_fffffffffffff5a8,
                                   (Vector3<double> *)
                                   CONCAT44(in_stack_fffffffffffff5a4,in_stack_fffffffffffff5a0));
                RectMatrix<double,_3U,_3U>::operator-=
                          ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff560,
                           (RectMatrix<double,_3U,_3U> *)
                           CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
                SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x14bbc8);
                if ((*(byte *)(in_RDI + 0xc) & 1) != 0) {
                  in_stack_fffffffffffff5a8 = *(Vector3<double> **)(in_RDI + 0x30);
                  in_stack_fffffffffffff5b0 =
                       (vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *
                       )dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffff570,
                                       (Vector<double,_3U> *)in_stack_fffffffffffff568);
                  OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff568,
                                    (double)in_stack_fffffffffffff560);
                  Vector3<double>::Vector3
                            ((Vector3<double> *)in_stack_fffffffffffff560,
                             (Vector<double,_3U> *)
                             CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
                  (*(code *)(((_Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               *)&in_stack_fffffffffffff5a8->super_Vector<double,_3U>)->_M_impl).
                            super__Vector_impl_data._M_start[0xf].super_Vector<double,_3U>.data_[0])
                            (in_stack_fffffffffffff5a8,local_6a8);
                }
              }
              __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&local_260);
            }
          }
        }
      }
    }
    if (local_26c == 0) {
      bVar5 = SimInfo::requiresPrepair(*(SimInfo **)(in_RDI + 0x18));
      in_stack_fffffffffffff5a4 = CONCAT13(bVar5,(int3)in_stack_fffffffffffff5a4);
      if (bVar5) {
        (**(code **)(**(long **)(in_RDI + 0x30) + 0x30))();
        for (local_6c4 = 0; uVar6 = local_6c4,
            in_stack_fffffffffffff5a0 = SimInfo::getNAtoms(*(SimInfo **)(in_RDI + 0x18)),
            uVar6 < in_stack_fffffffffffff5a0; local_6c4 = local_6c4 + 1) {
          if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
            local_248 = (**(code **)(**(long **)(in_RDI + 0x30) + 0x108))
                                  (*(long **)(in_RDI + 0x30),local_6c4);
            bVar5 = SelectionManager::isGlobalIDSelected
                              ((SelectionManager *)in_stack_fffffffffffff560,
                               in_stack_fffffffffffff55c);
            *(bool *)(in_RDI + 0xc40) = bVar5;
          }
          (**(code **)(**(long **)(in_RDI + 0x30) + 0x158))
                    (*(long **)(in_RDI + 0x30),in_RDI + 0xbc0,local_6c4);
          InteractionManager::doPreForce
                    (in_stack_fffffffffffff570,(SelfData *)in_stack_fffffffffffff568);
          (**(code **)(**(long **)(in_RDI + 0x30) + 0x160))
                    (*(long **)(in_RDI + 0x30),in_RDI + 0xbc0,local_6c4);
        }
        (**(code **)(**(long **)(in_RDI + 0x30) + 0x38))();
      }
    }
  }
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x40))();
  if (*(int *)(in_RDI + 0x68) == 5) {
    InteractionManager::doReciprocalSpaceSum
              ((InteractionManager *)in_stack_fffffffffffff560,
               (RealType *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    Snapshot::setReciprocalPotential(local_10,local_1f0);
  }
  if ((*(byte *)(in_RDI + 0xf) & 1) != 0) {
    InteractionManager::doSurfaceTerm
              (in_stack_fffffffffffff570,SUB81((ulong)in_stack_fffffffffffff568 >> 0x38,0),
               (int)in_stack_fffffffffffff568,(RealType *)in_stack_fffffffffffff560);
    Snapshot::setSurfacePotential(local_10,local_1f8);
  }
  bVar5 = SimInfo::requiresSelfCorrection(*(SimInfo **)(in_RDI + 0x18));
  if (bVar5) {
    for (local_6c8 = 0; uVar6 = local_6c8, uVar7 = SimInfo::getNAtoms(*(SimInfo **)(in_RDI + 0x18)),
        uVar6 < uVar7; local_6c8 = local_6c8 + 1) {
      if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
        local_248 = (**(code **)(**(long **)(in_RDI + 0x30) + 0x108))
                              (*(long **)(in_RDI + 0x30),local_6c8);
        bVar5 = SelectionManager::isGlobalIDSelected
                          ((SelectionManager *)in_stack_fffffffffffff560,in_stack_fffffffffffff55c);
        *(bool *)(in_RDI + 0xc40) = bVar5;
      }
      (**(code **)(**(long **)(in_RDI + 0x30) + 0x148))
                (*(long **)(in_RDI + 0x30),in_RDI + 0xbc0,local_6c8);
      InteractionManager::doSelfCorrection
                (in_stack_fffffffffffff570,(SelfData *)in_stack_fffffffffffff568);
      (**(code **)(**(long **)(in_RDI + 0x30) + 0x150))
                (*(long **)(in_RDI + 0x30),in_RDI + 0xbc0,local_6c8);
    }
  }
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x48))();
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x58))(local_700);
  Vector<double,_7U>::operator=
            ((Vector<double,_7U> *)in_stack_fffffffffffff568,
             (Vector<double,_7U> *)in_stack_fffffffffffff560);
  Vector<double,_7U>::Vector
            ((Vector<double,_7U> *)in_stack_fffffffffffff570,
             (Vector<double,_7U> *)in_stack_fffffffffffff568);
  Snapshot::setLongRangePotentials
            (in_stack_fffffffffffff560,
             (potVec *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x50))(local_770);
  Vector<double,_7U>::operator=
            ((Vector<double,_7U> *)in_stack_fffffffffffff568,
             (Vector<double,_7U> *)in_stack_fffffffffffff560);
  this_02 = local_10;
  Vector<double,_7U>::Vector
            ((Vector<double,_7U> *)local_10,(Vector<double,_7U> *)in_stack_fffffffffffff568);
  Snapshot::setSelfPotentials
            (in_stack_fffffffffffff560,
             (potVec *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  v1 = local_10;
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x70))(local_818);
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x60))(local_850);
  OpenMD::operator+((Vector<double,_7U> *)v1,(Vector<double,_7U> *)in_stack_fffffffffffff560);
  Snapshot::setExcludedPotentials
            (in_stack_fffffffffffff560,
             (potVec *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  if ((*(byte *)(in_RDI + 0x220) & 1) != 0) {
    Snapshot::getSelectionPotentials
              ((Snapshot *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    Vector<double,_7U>::operator=
              ((Vector<double,_7U> *)v1,(Vector<double,_7U> *)in_stack_fffffffffffff560);
    (**(code **)(**(long **)(in_RDI + 0x30) + 0x78))(local_8c0);
    Vector<double,_7U>::operator+=
              ((Vector<double,_7U> *)in_stack_fffffffffffff560,
               (Vector<double,_7U> *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    (**(code **)(**(long **)(in_RDI + 0x30) + 0x68))(local_8f8);
    Vector<double,_7U>::operator+=
              ((Vector<double,_7U> *)in_stack_fffffffffffff560,
               (Vector<double,_7U> *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
    this_01 = local_10;
    Vector<double,_7U>::Vector((Vector<double,_7U> *)this_02,(Vector<double,_7U> *)v1);
    Snapshot::setSelectionPotentials
              (this_01,(potVec *)CONCAT44(in_stack_fffffffffffff55c,in_stack_fffffffffffff558));
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_02);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_02);
  return;
}

Assistant:

void ForceManager::longRangeInteractions() {
    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    fDecomp_->setSnapshot(curSnapshot);

    DataStorage* config   = &(curSnapshot->atomData);
    DataStorage* cgConfig = &(curSnapshot->cgData);

    // calculate the center of mass of cutoff group

    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;

    if (info_->getNCutoffGroups() != info_->getNAtoms()) {
      for (mol = info_->beginMolecule(mi); mol != NULL;
           mol = info_->nextMolecule(mi)) {
        for (cg = mol->beginCutoffGroup(ci); cg != NULL;
             cg = mol->nextCutoffGroup(ci)) {
          cg->updateCOM();
        }
      }
    } else {
      // center of mass of the group is the same as position of the atom
      // if cutoff group does not exist
      cgConfig->position = config->position;
      cgConfig->velocity = config->velocity;
    }

    fDecomp_->zeroWorkArrays();
    fDecomp_->distributeData();

    int cg1, cg2, atom1, atom2;
    Vector3d d_grp, dag, gvel2, vel2;
    RealType rgrpsq, rgrp;
    RealType vij(0.0);
    Vector3d fij, fg, f1;
    bool in_switching_region;
    RealType dswdr, swderiv;
    vector<int> atomListColumn, atomListRow;

    potVec longRangePotential(0.0);
    potVec selfPotential(0.0);
    RealType reciprocalPotential(0.0);
    RealType surfacePotential(0.0);
    potVec selectionPotential(0.0);

    RealType mf;
    bool newAtom1;
    int gid1, gid2;

    vector<int>::iterator ia, jb;

    int loopStart, loopEnd;

    idat.rcut       = rCut_;
    idat.shiftedPot = (cutoffMethod_ == SHIFTED_POTENTIAL) ? true : false;
    idat.shiftedForce =
        (cutoffMethod_ == SHIFTED_FORCE || cutoffMethod_ == TAYLOR_SHIFTED) ?
            true :
            false;
    idat.doParticlePot   = doParticlePot_;
    idat.doElectricField = doElectricField_;
    idat.doSitePotential = doSitePotential_;
    sdat.doParticlePot   = doParticlePot_;

    loopEnd = PAIR_LOOP;
    if (info_->requiresPrepair()) {
      loopStart = PREPAIR_LOOP;
    } else {
      loopStart = PAIR_LOOP;
    }
    for (int iLoop = loopStart; iLoop <= loopEnd; iLoop++) {
      if (iLoop == loopStart) {
        bool update_nlist = fDecomp_->checkNeighborList(savedPositions_);

        if (update_nlist) {
          if (!usePeriodicBoundaryConditions_)
            Mat3x3d bbox = thermo->getBoundingBox();
          fDecomp_->buildNeighborList(neighborList_, point_, savedPositions_);
        }
      }

      for (cg1 = 0; cg1 < int(point_.size()) - 1; cg1++) {
        atomListRow = fDecomp_->getAtomsInGroupRow(cg1);
        newAtom1    = true;

        for (int m2 = point_[cg1]; m2 < point_[cg1 + 1]; m2++) {
          cg2 = neighborList_[m2];

          d_grp = fDecomp_->getIntergroupVector(cg1, cg2);

          // already wrapped in the getIntergroupVector call:
          // curSnapshot->wrapVector(d_grp);
          rgrpsq = d_grp.lengthSquare();

          if (rgrpsq < rCutSq_) {
            if (iLoop == PAIR_LOOP) {
              vij = 0.0;
              fij.zero();
              idat.eField1.zero();
              idat.eField2.zero();
              idat.sPot1 = 0.0;
              idat.sPot2 = 0.0;
            }

            in_switching_region =
                switcher_->getSwitch(rgrpsq, idat.sw, dswdr, rgrp);

            atomListColumn = fDecomp_->getAtomsInGroupColumn(cg2);

            if (doHeatFlux_) gvel2 = fDecomp_->getGroupVelocityColumn(cg2);

            for (ia = atomListRow.begin(); ia != atomListRow.end(); ++ia) {
              atom1 = (*ia);
              if (atomListRow.size() > 1) newAtom1 = true;

              if (doPotentialSelection_) {
                gid1            = fDecomp_->getGlobalIDRow(atom1);
                idat.isSelected = seleMan_.isGlobalIDSelected(gid1);
              }

              for (jb = atomListColumn.begin(); jb != atomListColumn.end();
                   ++jb) {
                atom2 = (*jb);

                if (doPotentialSelection_) {
                  gid2 = fDecomp_->getGlobalIDCol(atom2);
                  idat.isSelected |= seleMan_.isGlobalIDSelected(gid2);
                }

                if (!fDecomp_->skipAtomPair(atom1, atom2, cg1, cg2)) {
                  idat.vpair       = 0.0;
                  idat.pot         = 0.0;
                  idat.excludedPot = 0.0;
                  idat.selePot     = 0.0;
                  idat.f1.zero();
                  idat.dVdFQ1 = 0.0;
                  idat.dVdFQ2 = 0.0;

                  fDecomp_->fillInteractionData(idat, atom1, atom2, newAtom1);
                  newAtom1 = false;

                  idat.topoDist =
                      fDecomp_->getTopologicalDistance(atom1, atom2);
                  idat.vdwMult     = vdwScale_[idat.topoDist];
                  idat.electroMult = electrostaticScale_[idat.topoDist];

                  if (atomListRow.size() == 1 && atomListColumn.size() == 1) {
                    idat.d  = d_grp;
                    idat.r2 = rgrpsq;
                    if (doHeatFlux_) vel2 = gvel2;
                  } else {
                    idat.d = fDecomp_->getInteratomicVector(atom1, atom2);
                    curSnapshot->wrapVector(idat.d);
                    idat.r2 = idat.d.lengthSquare();
                    if (doHeatFlux_)
                      vel2 = fDecomp_->getAtomVelocityColumn(atom2);
                  }

                  idat.rij = sqrt(idat.r2);

                  if (iLoop == PREPAIR_LOOP) {
                    interactionMan_->doPrePair(idat);
                    fDecomp_->unpackPrePairData(idat, atom1, atom2);
                  } else {
                    interactionMan_->doPair(idat);
                    fDecomp_->unpackInteractionData(idat, atom1, atom2);
                    vij += idat.vpair;
                    fij += idat.f1;
                    virialTensor -= outProduct(idat.d, idat.f1);
                    if (doHeatFlux_)
                      fDecomp_->addToHeatFlux(idat.d * dot(idat.f1, vel2));
                  }
                }
              }
            }

            if (iLoop == PAIR_LOOP) {
              if (in_switching_region) {
                swderiv = vij * dswdr / rgrp;
                fg      = swderiv * d_grp;
                fij += fg;

                if (atomListRow.size() == 1 && atomListColumn.size() == 1) {
                  if (!fDecomp_->skipAtomPair(atomListRow[0], atomListColumn[0],
                                              cg1, cg2)) {
                    virialTensor -= outProduct(idat.d, fg);
                    if (doHeatFlux_)
                      fDecomp_->addToHeatFlux(idat.d * dot(fg, vel2));
                  }
                }

                for (ia = atomListRow.begin(); ia != atomListRow.end(); ++ia) {
                  atom1 = (*ia);
                  mf    = fDecomp_->getMassFactorRow(atom1);
                  // fg is the force on atom ia due to cutoff group's
                  // presence in switching region
                  fg = swderiv * d_grp * mf;
                  fDecomp_->addForceToAtomRow(atom1, fg);
                  if (atomListRow.size() > 1) {
                    if (info_->usesAtomicVirial()) {
                      // find the distance between the atom
                      // and the center of the cutoff group:
                      dag = fDecomp_->getAtomToGroupVectorRow(atom1, cg1);
                      virialTensor -= outProduct(dag, fg);
                      if (doHeatFlux_)
                        fDecomp_->addToHeatFlux(dag * dot(fg, vel2));
                    }
                  }
                }
                for (jb = atomListColumn.begin(); jb != atomListColumn.end();
                     ++jb) {
                  atom2 = (*jb);
                  mf    = fDecomp_->getMassFactorColumn(atom2);
                  // fg is the force on atom jb due to cutoff group's
                  // presence in switching region
                  fg = -swderiv * d_grp * mf;
                  fDecomp_->addForceToAtomColumn(atom2, fg);

                  if (atomListColumn.size() > 1) {
                    if (info_->usesAtomicVirial()) {
                      // find the distance between the atom
                      // and the center of the cutoff group:
                      dag = fDecomp_->getAtomToGroupVectorColumn(atom2, cg2);
                      virialTensor -= outProduct(dag, fg);
                      if (doHeatFlux_)
                        fDecomp_->addToHeatFlux(dag * dot(fg, vel2));
                    }
                  }
                }
              }
              // if (!info_->usesAtomicVirial()) {
              //  virialTensor -= outProduct(d_grp, fij);
              //  if (doHeatFlux_)
              //     fDecomp_->addToHeatFlux( d_grp * dot(fij, vel2));
              //}
            }
          }
        }
      }

      if (iLoop == PREPAIR_LOOP) {
        if (info_->requiresPrepair()) {
          fDecomp_->collectIntermediateData();

          for (unsigned int atom1 = 0; atom1 < info_->getNAtoms(); atom1++) {
            if (doPotentialSelection_) {
              gid1            = fDecomp_->getGlobalID(atom1);
              sdat.isSelected = seleMan_.isGlobalIDSelected(gid1);
            }
            fDecomp_->fillPreForceData(sdat, atom1);
            interactionMan_->doPreForce(sdat);
            fDecomp_->unpackPreForceData(sdat, atom1);
          }

          fDecomp_->distributeIntermediateData();
        }
      }
    }

    // collects pairwise information
    fDecomp_->collectData();
    if (cutoffMethod_ == EWALD_FULL) {
      interactionMan_->doReciprocalSpaceSum(reciprocalPotential);
      curSnapshot->setReciprocalPotential(reciprocalPotential);
    }

    if (useSurfaceTerm_) {
      interactionMan_->doSurfaceTerm(useSlabGeometry_, axis_, surfacePotential);
      curSnapshot->setSurfacePotential(surfacePotential);
    }

    if (info_->requiresSelfCorrection()) {
      for (unsigned int atom1 = 0; atom1 < info_->getNAtoms(); atom1++) {
        if (doPotentialSelection_) {
          gid1            = fDecomp_->getGlobalID(atom1);
          sdat.isSelected = seleMan_.isGlobalIDSelected(gid1);
        }
        fDecomp_->fillSelfData(sdat, atom1);
        interactionMan_->doSelfCorrection(sdat);
        fDecomp_->unpackSelfData(sdat, atom1);
      }
    }

    // collects single-atom information
    fDecomp_->collectSelfData();

    longRangePotential = fDecomp_->getPairwisePotential();
    curSnapshot->setLongRangePotentials(longRangePotential);

    selfPotential = fDecomp_->getSelfPotential();
    curSnapshot->setSelfPotentials(selfPotential);

    curSnapshot->setExcludedPotentials(fDecomp_->getExcludedSelfPotential() +
                                       fDecomp_->getExcludedPotential());

    if (doPotentialSelection_) {
      selectionPotential = curSnapshot->getSelectionPotentials();
      selectionPotential += fDecomp_->getSelectedSelfPotential();
      selectionPotential += fDecomp_->getSelectedPotential();
      curSnapshot->setSelectionPotentials(selectionPotential);
    }
  }